

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uintwide_t_n_base.h
# Opt level: O0

string * __thiscall
test_uintwide_t_n_base::
hexlexical_cast<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<65536u,65536u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)1>>
          (string *__return_storage_ptr__,test_uintwide_t_n_base *this,
          number<boost::multiprecision::backends::cpp_int_backend<24U,_24U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>
          *u)

{
  ostream *os;
  stringstream local_1a0 [8];
  stringstream ss;
  undefined1 local_190 [376];
  test_uintwide_t_n_base *local_18;
  number<boost::multiprecision::backends::cpp_int_backend<24U,_24U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>
  *u_local;
  
  local_18 = this;
  u_local = (number<boost::multiprecision::backends::cpp_int_backend<24U,_24U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>
             *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  os = (ostream *)std::ostream::operator<<(local_190,std::hex);
  boost::multiprecision::operator<<
            (os,(number<boost::multiprecision::backends::cpp_int_backend<24U,_24U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>
                 *)local_18);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

static auto hexlexical_cast(const UnsignedIntegralType& u) -> std::string
    {
      std::stringstream ss;

      ss << std::hex << u;

      return ss.str();
    }